

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderIndexingTests.cpp
# Opt level: O0

void __thiscall
vkt::sr::anon_unknown_0::IndexingTestUniformSetup::setup
          (IndexingTestUniformSetup *this,ShaderRenderCaseInstance *instance,Vec4 *constCoords)

{
  TestError *this_00;
  float *data;
  int a;
  float fVar1;
  Vector<float,_4> *local_230;
  allocator<char> local_209;
  string local_208;
  tcu local_1e4 [8];
  float local_1dc [2];
  tcu local_1d4 [8];
  float local_1cc [2];
  tcu local_1c4 [8];
  float local_1bc [2];
  undefined1 local_1b4 [24];
  Vector<float,_3> local_19c;
  float fStack_190;
  undefined1 local_18c [24];
  Vector<float,_3> local_174;
  float fStack_168;
  undefined1 local_164 [24];
  Vector<float,_3> local_14c;
  float fStack_140;
  undefined1 local_13c [12];
  Vector<float,_3> local_130;
  float fStack_124;
  undefined1 local_120 [16];
  Vector<float,_2> local_110;
  float local_108 [2];
  undefined1 local_100 [16];
  Vector<float,_2> local_f0;
  float local_e8 [2];
  undefined1 local_e0 [16];
  Vector<float,_2> local_d0;
  float local_c8 [2];
  undefined1 local_c0 [8];
  Vector<float,_2> local_b8;
  float local_b0 [2];
  Vector<float,_4> local_a8;
  Vector<float,_4> local_98;
  Vector<float,_4> local_88;
  float local_78 [2];
  float local_70 [2];
  float local_68 [2];
  Vec4 arr [4];
  Vec4 *constCoords_local;
  ShaderRenderCaseInstance *instance_local;
  IndexingTestUniformSetup *this_local;
  
  ShaderRenderCaseInstance::useUniform(instance,0,UI_ZERO);
  ShaderRenderCaseInstance::useUniform(instance,1,UI_ONE);
  ShaderRenderCaseInstance::useUniform(instance,2,UI_TWO);
  ShaderRenderCaseInstance::useUniform(instance,3,UI_THREE);
  ShaderRenderCaseInstance::useUniform(instance,4,UI_FOUR);
  if ((this->m_usesArray & 1U) != 0) {
    local_230 = (Vector<float,_4> *)local_68;
    do {
      tcu::Vector<float,_4>::Vector(local_230);
      local_230 = local_230 + 1;
    } while (local_230 != (Vector<float,_4> *)(arr[3].m_data + 2));
    if (this->m_varType == TYPE_FLOAT) {
      fVar1 = tcu::Vector<float,_4>::x(constCoords);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_78,fVar1);
      local_68[0] = local_78[0];
      local_68[1] = local_78[1];
      arr[0].m_data[0] = local_70[0];
      arr[0].m_data[1] = local_70[1];
      fVar1 = tcu::Vector<float,_4>::x(constCoords);
      tcu::Vector<float,_4>::Vector(&local_88,fVar1 * 0.5);
      arr[0].m_data[2] = local_88.m_data[0];
      arr[0].m_data[3] = local_88.m_data[1];
      arr[1].m_data[0] = local_88.m_data[2];
      arr[1].m_data[1] = local_88.m_data[3];
      fVar1 = tcu::Vector<float,_4>::x(constCoords);
      tcu::Vector<float,_4>::Vector(&local_98,fVar1 * 0.25);
      arr[1].m_data[2] = local_98.m_data[0];
      arr[1].m_data[3] = local_98.m_data[1];
      arr[2].m_data[0] = local_98.m_data[2];
      arr[2].m_data[1] = local_98.m_data[3];
      fVar1 = tcu::Vector<float,_4>::x(constCoords);
      tcu::Vector<float,_4>::Vector(&local_a8,fVar1 * 0.125);
      arr[2].m_data[2] = local_a8.m_data[0];
      arr[2].m_data[3] = local_a8.m_data[1];
      arr[3].m_data[0] = local_a8.m_data[2];
      arr[3].m_data[1] = local_a8.m_data[3];
    }
    else {
      a = (int)constCoords;
      if (this->m_varType == TYPE_FLOAT_VEC2) {
        tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_c0,a,0);
        tcu::Vector<float,_2>::toWidth<4>(&local_b8);
        local_68[0] = local_b8.m_data[0];
        local_68[1] = local_b8.m_data[1];
        arr[0].m_data[0] = local_b0[0];
        arr[0].m_data[1] = local_b0[1];
        tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_e0,a,0);
        tcu::operator*((tcu *)(local_e0 + 8),(Vector<float,_2> *)local_e0,0.5);
        tcu::Vector<float,_2>::toWidth<4>(&local_d0);
        arr[0].m_data[2] = local_d0.m_data[0];
        arr[0].m_data[3] = local_d0.m_data[1];
        arr[1].m_data[0] = local_c8[0];
        arr[1].m_data[1] = local_c8[1];
        tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_100,a,0);
        tcu::operator*((tcu *)(local_100 + 8),(Vector<float,_2> *)local_100,0.25);
        tcu::Vector<float,_2>::toWidth<4>(&local_f0);
        arr[1].m_data[2] = local_f0.m_data[0];
        arr[1].m_data[3] = local_f0.m_data[1];
        arr[2].m_data[0] = local_e8[0];
        arr[2].m_data[1] = local_e8[1];
        tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_120,a,0);
        tcu::operator*((tcu *)(local_120 + 8),(Vector<float,_2> *)local_120,0.125);
        tcu::Vector<float,_2>::toWidth<4>(&local_110);
        arr[2].m_data[2] = local_110.m_data[0];
        arr[2].m_data[3] = local_110.m_data[1];
        arr[3].m_data[0] = local_108[0];
        arr[3].m_data[1] = local_108[1];
      }
      else if (this->m_varType == TYPE_FLOAT_VEC3) {
        tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_13c,a,0,1);
        tcu::Vector<float,_3>::toWidth<4>(&local_130);
        local_68[0] = local_130.m_data[0];
        local_68[1] = local_130.m_data[1];
        arr[0].m_data[0] = local_130.m_data[2];
        arr[0].m_data[1] = fStack_124;
        tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_164,a,0,1);
        tcu::operator*((tcu *)(local_164 + 0xc),(Vector<float,_3> *)local_164,0.5);
        tcu::Vector<float,_3>::toWidth<4>(&local_14c);
        arr[0].m_data[2] = local_14c.m_data[0];
        arr[0].m_data[3] = local_14c.m_data[1];
        arr[1].m_data[0] = local_14c.m_data[2];
        arr[1].m_data[1] = fStack_140;
        tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_18c,a,0,1);
        tcu::operator*((tcu *)(local_18c + 0xc),(Vector<float,_3> *)local_18c,0.25);
        tcu::Vector<float,_3>::toWidth<4>(&local_174);
        arr[1].m_data[2] = local_174.m_data[0];
        arr[1].m_data[3] = local_174.m_data[1];
        arr[2].m_data[0] = local_174.m_data[2];
        arr[2].m_data[1] = fStack_168;
        tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_1b4,a,0,1);
        tcu::operator*((tcu *)(local_1b4 + 0xc),(Vector<float,_3> *)local_1b4,0.125);
        tcu::Vector<float,_3>::toWidth<4>(&local_19c);
        arr[2].m_data[2] = local_19c.m_data[0];
        arr[2].m_data[3] = local_19c.m_data[1];
        arr[3].m_data[0] = local_19c.m_data[2];
        arr[3].m_data[1] = fStack_190;
      }
      else {
        if (this->m_varType != TYPE_FLOAT_VEC4) {
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_208,"invalid data type for u_arr",&local_209);
          tcu::TestError::TestError(this_00,&local_208);
          __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        local_68 = *(float (*) [2])constCoords->m_data;
        arr[0].m_data._0_8_ = *(undefined8 *)(constCoords->m_data + 2);
        tcu::operator*(local_1c4,constCoords,0.5);
        arr[0].m_data._8_8_ = local_1c4;
        arr[1].m_data[0] = local_1bc[0];
        arr[1].m_data[1] = local_1bc[1];
        tcu::operator*(local_1d4,constCoords,0.25);
        arr[1].m_data._8_8_ = local_1d4;
        arr[2].m_data[0] = local_1cc[0];
        arr[2].m_data[1] = local_1cc[1];
        tcu::operator*(local_1e4,constCoords,0.125);
        arr[2].m_data._8_8_ = local_1e4;
        arr[3].m_data[0] = local_1dc[0];
        arr[3].m_data[1] = local_1dc[1];
      }
    }
    data = tcu::Vector<float,_4>::getPtr((Vector<float,_4> *)local_68);
    ShaderRenderCaseInstance::addUniform(instance,5,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,0x40,data);
  }
  return;
}

Assistant:

void IndexingTestUniformSetup::setup (ShaderRenderCaseInstance& instance, const tcu::Vec4& constCoords) const
{
	instance.useUniform(0u, UI_ZERO);
	instance.useUniform(1u, UI_ONE);
	instance.useUniform(2u, UI_TWO);
	instance.useUniform(3u, UI_THREE);
	instance.useUniform(4u, UI_FOUR);

	if (m_usesArray)
	{
		Vec4 arr[4];
		if (m_varType == TYPE_FLOAT)
		{
			arr[0] = Vec4(constCoords.x());
			arr[1] = Vec4(constCoords.x() * 0.5f);
			arr[2] = Vec4(constCoords.x() * 0.25f);
			arr[3] = Vec4(constCoords.x() * 0.125f);
		}
		else if (m_varType == TYPE_FLOAT_VEC2)
		{
			arr[0] = constCoords.swizzle(0, 1).toWidth<4>();
			arr[1] = (constCoords.swizzle(0, 1) * 0.5f).toWidth<4>();
			arr[2] = (constCoords.swizzle(0, 1) * 0.25f).toWidth<4>();
			arr[3] = (constCoords.swizzle(0, 1) * 0.125f).toWidth<4>();
		}
		else if (m_varType == TYPE_FLOAT_VEC3)
		{
			arr[0] = constCoords.swizzle(0, 1, 2).toWidth<4>();
			arr[1] = (constCoords.swizzle(0, 1, 2) * 0.5f).toWidth<4>();
			arr[2] = (constCoords.swizzle(0, 1, 2) * 0.25f).toWidth<4>();
			arr[3] = (constCoords.swizzle(0, 1, 2) * 0.125f).toWidth<4>();
		}
		else if (m_varType == TYPE_FLOAT_VEC4)
		{
			arr[0] = constCoords;
			arr[1] = constCoords * 0.5f;
			arr[2] = constCoords * 0.25f;
			arr[3] = constCoords * 0.125f;
		}
		else
			throw tcu::TestError("invalid data type for u_arr");

			instance.addUniform(5u, vk::VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, sizeof(Vec4) * 4, arr[0].getPtr());
	}
}